

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conformance.cc
# Opt level: O2

void anon_unknown.dwarf_52c0::require_conform(string *expected,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ExpressionDecomposer local_26c;
  va_list args_1;
  string npf_result;
  string *local_218;
  Enum local_210;
  string sys_printf_result;
  char buf [256];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  sys_printf_result._M_dataplus._M_p = (pointer)&sys_printf_result.field_2;
  sys_printf_result._M_string_length = 0;
  sys_printf_result.field_2._M_local_buf[0] = '\0';
  npf_result._M_dataplus._M_p = (pointer)0x3000000010;
  npf_result._M_string_length = (size_type)&stack0x00000008;
  npf_result.field_2._M_allocated_capacity = (size_type)local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  vsnprintf(buf,0x100,fmt,&npf_result);
  buf[0xff] = '\0';
  std::__cxx11::string::assign((char *)&sys_printf_result);
  npf_result._M_dataplus._M_p = (pointer)&npf_result.field_2;
  npf_result._M_string_length = 0;
  npf_result.field_2._M_allocated_capacity =
       npf_result.field_2._M_allocated_capacity & 0xffffffffffffff00;
  args_1[0].gp_offset = 0x10;
  args_1[0].fp_offset = 0x30;
  args_1[0].overflow_arg_area = &stack0x00000008;
  args_1[0].reg_save_area = local_e8;
  npf_vsnprintf(buf,0x100,fmt,args_1);
  buf[0xff] = '\0';
  std::__cxx11::string::assign((char *)&npf_result);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_26c,DT_REQUIRE);
  local_210 = local_26c.m_at;
  local_218 = &sys_printf_result;
  doctest::detail::Expression_lhs<std::__cxx11::string&>::operator==
            ((Result *)args_1,(Expression_lhs<std::__cxx11::string&> *)&local_218,expected);
  doctest::detail::decomp_assert
            (DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/charlesnicholson[P]nanoprintf/tests/conformance.cc"
             ,0x3b,"sys_printf_result == expected",(Result *)args_1);
  doctest::String::~String((String *)&args_1[0].overflow_arg_area);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_26c,DT_REQUIRE);
  local_210 = local_26c.m_at;
  local_218 = &npf_result;
  doctest::detail::Expression_lhs<std::__cxx11::string&>::operator==
            ((Result *)args_1,(Expression_lhs<std::__cxx11::string&> *)&local_218,expected);
  doctest::detail::decomp_assert
            (DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/charlesnicholson[P]nanoprintf/tests/conformance.cc"
             ,0x3c,"npf_result == expected",(Result *)args_1);
  doctest::String::~String((String *)&args_1[0].overflow_arg_area);
  std::__cxx11::string::~string((string *)&npf_result);
  std::__cxx11::string::~string((string *)&sys_printf_result);
  return;
}

Assistant:

void require_conform(const std::string& expected, char const *fmt, ...) {
  char buf[256];

  std::string sys_printf_result; {
    va_list args;
    va_start(args, fmt);
    vsnprintf(buf, sizeof(buf), fmt, args);
    va_end(args);
    buf[sizeof(buf)-1] = '\0';
    sys_printf_result = buf;
  }

  std::string npf_result; {
    va_list args;
    va_start(args, fmt);
    npf_vsnprintf(buf, sizeof(buf), fmt, args);
    va_end(args);
    buf[sizeof(buf)-1] = '\0';
    npf_result = buf;
  }

  REQUIRE(sys_printf_result == expected);
  REQUIRE(npf_result == expected);
}